

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O1

size_t __thiscall kws::Parser::IsTemplated(Parser *this,string *buffer,size_t classnamepos)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong unaff_RBP;
  int iVar6;
  int iVar7;
  size_t sVar8;
  size_t local_38;
  
  local_38 = std::__cxx11::string::find((char *)buffer,0x178140,0);
  sVar8 = local_38;
  do {
    if (classnamepos <= sVar8) {
      return local_38;
    }
    uVar4 = std::__cxx11::string::find((char *)buffer,0x178498,sVar8);
    if (uVar4 == 0xffffffffffffffff) {
LAB_0012520b:
      uVar5 = 0xffffffffffffffff;
    }
    else {
      iVar6 = 1;
      do {
        uVar5 = uVar4 + 1;
        if (classnamepos <= uVar5) goto LAB_0012520b;
        cVar1 = (buffer->_M_dataplus)._M_p[uVar4 + 1];
        iVar7 = -(uint)(cVar1 == '>');
        if (cVar1 == '<') {
          iVar7 = 1;
        }
        iVar6 = iVar6 + iVar7;
        uVar4 = uVar5;
      } while (iVar6 != 0);
    }
    if (uVar5 < classnamepos) {
      uVar5 = uVar5 + 1;
      bVar3 = true;
      if (uVar5 < classnamepos) {
        bVar2 = true;
        bVar3 = true;
        do {
          cVar1 = (buffer->_M_dataplus)._M_p[uVar5];
          if (((cVar1 != '\n') && (cVar1 != '\r')) && (bVar3 = bVar2, cVar1 != '\t')) {
            bVar2 = false;
            bVar3 = false;
          }
          uVar5 = uVar5 + 1;
        } while (classnamepos != uVar5);
      }
      if (!bVar3) goto LAB_00125253;
      bVar3 = false;
      unaff_RBP = sVar8;
      uVar4 = sVar8;
    }
    else {
LAB_00125253:
      uVar4 = std::__cxx11::string::find((char *)buffer,0x178140,sVar8 + 1);
      bVar3 = true;
      local_38 = sVar8;
    }
    sVar8 = uVar4;
    if (!bVar3) {
      return unaff_RBP;
    }
  } while( true );
}

Assistant:

size_t Parser::IsTemplated(const std::string & buffer, size_t classnamepos) const
{
  size_t templatepos = buffer.find("template",0);
  size_t returnval = templatepos;

  while(templatepos!=std::string::npos && templatepos<classnamepos)
    {
    // find the last > that corresponding to the template
    size_t p0 = buffer.find("<",templatepos);
    size_t pos = std::string::npos;
    if(p0!=std::string::npos)
      {
      size_t i=p0+1;
      unsigned int n=1;

      while(i<classnamepos && n>0)
        {
        if(buffer[i] == '<')
          {
          n++;
          }
        else if(buffer[i] == '>')
          {
          n--;
          }
        if(n==0)
          {
          pos =i;
          break;
          }
        i++;
        }
      }

    if(pos<classnamepos && pos!=std::string::npos)
      {
      bool ok = true;
      // Check if between the last > and classnamepos we don't have words
      for(size_t i=pos+1;i<classnamepos;i++)
        {
        if(buffer.c_str()[i] != 13 && buffer.c_str()[i] != '\n' && buffer.c_str()[i]!= '\t')
          {
          ok = false;
          }
        }
      if(ok)
        {
        return templatepos;
        }
      /*else
        {
        std::cout << "ERROR in Parser::IsTemplated, Cannot find proper template parameters" << std::endl;
        system("PAUSE");
        }*/
      }
    returnval = templatepos;
    templatepos = buffer.find("template",templatepos+1);
    }

  return returnval;
}